

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

size_t propagatemark(global_State *g)

{
  uint8_t uVar1;
  ushort uVar2;
  GCfunc *fn_00;
  int iVar3;
  global_State *local_68;
  long local_60;
  GCtrace *T;
  lua_State *th;
  GCproto *pt;
  GCfunc *fn;
  GCtab *t;
  int gct;
  GCobj *o;
  global_State *g_local;
  
  fn_00 = (GCfunc *)(g->gc).gray.gcptr64;
  uVar1 = (fn_00->c).gct;
  (fn_00->c).marked = (fn_00->c).marked | 4;
  (g->gc).gray.gcptr64 = (fn_00->c).gclist.gcptr64;
  if (uVar1 == '\v') {
    iVar3 = gc_traverse_tab(g,(GCtab *)&fn_00->c);
    if (0 < iVar3) {
      (fn_00->c).marked = (fn_00->c).marked & 0xfb;
    }
    if ((fn_00->c).upvalue[0].field_4.it == 0) {
      local_60 = 0;
    }
    else {
      local_60 = (ulong)((fn_00->c).upvalue[0].field_4.it + 1) * 0x18;
    }
    g_local = (global_State *)((ulong)(fn_00->c).upvalue[0].u32.lo * 8 + 0x40 + local_60);
  }
  else if (uVar1 == '\b') {
    gc_traverse_func(g,fn_00);
    if ((fn_00->c).ffid == '\0') {
      local_68 = (global_State *)((ulong)(fn_00->c).nupvalues * 8 + 0x28);
    }
    else {
      local_68 = (global_State *)((ulong)(fn_00->c).nupvalues * 8 + 0x30);
    }
    g_local = local_68;
  }
  else if (uVar1 == '\a') {
    gc_traverse_proto(g,(GCproto *)&fn_00->c);
    g_local = (global_State *)(ulong)*(uint *)(fn_00 + 1);
  }
  else if (uVar1 == '\x06') {
    (fn_00->c).gclist.gcptr64 = (g->gc).grayagain.gcptr64;
    (g->gc).grayagain.gcptr64 = (uint64_t)fn_00;
    (fn_00->c).marked = (fn_00->c).marked & 0xfb;
    gc_traverse_thread(g,(lua_State *)&fn_00->c);
    g_local = (global_State *)((ulong)*(uint *)((long)fn_00 + 0x58) * 8 + 0x70);
  }
  else {
    gc_traverse_trace(g,(GCtrace *)&fn_00->c);
    uVar2._0_1_ = *(uint8_t *)((long)fn_00 + 10);
    uVar2._1_1_ = *(uint8_t *)((long)fn_00 + 0xb);
    g_local = (global_State *)
              ((ulong)(uint)(*(int *)((long)fn_00 + 0xc) - *(int *)&(fn_00->c).f) * 8 + 0x78 +
               (ulong)uVar2 * 0xc + (ulong)*(uint *)((long)&(fn_00->c).f + 4) * 4);
  }
  return (size_t)g_local;
}

Assistant:

static size_t propagatemark(global_State *g)
{
  GCobj *o = gcref(g->gc.gray);
  int gct = o->gch.gct;
  lj_assertG(isgray(o), "propagation of non-gray object");
  gray2black(o);
  setgcrefr(g->gc.gray, o->gch.gclist);  /* Remove from gray list. */
  if (LJ_LIKELY(gct == ~LJ_TTAB)) {
    GCtab *t = gco2tab(o);
    if (gc_traverse_tab(g, t) > 0)
      black2gray(o);  /* Keep weak tables gray. */
    return sizeof(GCtab) + sizeof(TValue) * t->asize +
			   (t->hmask ? sizeof(Node) * (t->hmask + 1) : 0);
  } else if (LJ_LIKELY(gct == ~LJ_TFUNC)) {
    GCfunc *fn = gco2func(o);
    gc_traverse_func(g, fn);
    return isluafunc(fn) ? sizeLfunc((MSize)fn->l.nupvalues) :
			   sizeCfunc((MSize)fn->c.nupvalues);
  } else if (LJ_LIKELY(gct == ~LJ_TPROTO)) {
    GCproto *pt = gco2pt(o);
    gc_traverse_proto(g, pt);
    return pt->sizept;
  } else if (LJ_LIKELY(gct == ~LJ_TTHREAD)) {
    lua_State *th = gco2th(o);
    setgcrefr(th->gclist, g->gc.grayagain);
    setgcref(g->gc.grayagain, o);
    black2gray(o);  /* Threads are never black. */
    gc_traverse_thread(g, th);
    return sizeof(lua_State) + sizeof(TValue) * th->stacksize;
  } else {
#if LJ_HASJIT
    GCtrace *T = gco2trace(o);
    gc_traverse_trace(g, T);
    return ((sizeof(GCtrace)+7)&~7) + (T->nins-T->nk)*sizeof(IRIns) +
	   T->nsnap*sizeof(SnapShot) + T->nsnapmap*sizeof(SnapEntry);
#else
    lj_assertG(0, "bad GC type %d", gct);
    return 0;
#endif
  }
}